

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O1

CURLcode eyeballer_new(eyeballer **pballer,cf_ip_connect_create *cf_create,Curl_addrinfo *addr,
                      int ai_family,eyeballer *primary,timediff_t delay_ms,timediff_t timeout_ms,
                      expire_id timeout_id)

{
  eyeballer *peVar1;
  char *pcVar2;
  CURLcode CVar3;
  char *pcVar4;
  byte bVar5;
  
  *pballer = (eyeballer *)0x0;
  peVar1 = (eyeballer *)(*Curl_ccalloc)(1,0x68);
  if (peVar1 == (eyeballer *)0x0) {
    CVar3 = CURLE_OUT_OF_MEMORY;
  }
  else {
    pcVar4 = "ip";
    if (ai_family == 10) {
      pcVar4 = "ipv6";
    }
    pcVar2 = "ipv4";
    if (ai_family != 2) {
      pcVar2 = pcVar4;
    }
    peVar1->name = pcVar2;
    peVar1->cf_create = cf_create;
    peVar1->addr = addr;
    peVar1->first = addr;
    peVar1->ai_family = ai_family;
    peVar1->primary = primary;
    peVar1->delay_ms = delay_ms;
    CVar3 = CURLE_OK;
    do {
      if ((addr == (Curl_addrinfo *)0x0) || (addr = addr->ai_next, addr == (Curl_addrinfo *)0x0)) {
        bVar5 = 0;
        goto LAB_0011ce75;
      }
    } while (addr->ai_family != ai_family);
    bVar5 = 1;
LAB_0011ce75:
    peVar1->timeoutms = (ulong)timeout_ms >> (600 < timeout_ms & bVar5);
    peVar1->timeout_id = timeout_id;
    peVar1->result = CURLE_COULDNT_CONNECT;
    *pballer = peVar1;
  }
  return CVar3;
}

Assistant:

static CURLcode eyeballer_new(struct eyeballer **pballer,
                              cf_ip_connect_create *cf_create,
                              const struct Curl_addrinfo *addr,
                              int ai_family,
                              struct eyeballer *primary,
                              timediff_t delay_ms,
                              timediff_t timeout_ms,
                              expire_id timeout_id)
{
  struct eyeballer *baller;

  *pballer = NULL;
  baller = calloc(1, sizeof(*baller));
  if(!baller)
    return CURLE_OUT_OF_MEMORY;

  baller->name = ((ai_family == AF_INET) ? "ipv4" : (
#ifdef USE_IPV6
                  (ai_family == AF_INET6) ? "ipv6" :
#endif
                  "ip"));
  baller->cf_create = cf_create;
  baller->first = baller->addr = addr;
  baller->ai_family = ai_family;
  baller->primary = primary;
  baller->delay_ms = delay_ms;
  baller->timeoutms = addr_next_match(baller->addr, baller->ai_family) ?
    USETIME(timeout_ms) : timeout_ms;
  baller->timeout_id = timeout_id;
  baller->result = CURLE_COULDNT_CONNECT;

  *pballer = baller;
  return CURLE_OK;
}